

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O2

void __thiscall
cmCTestCoverageHandler::EndCoverageLogFile
          (cmCTestCoverageHandler *this,cmGeneratedFileStream *ostr,int logFileCount)

{
  cmCTest *this_00;
  ostream *poVar1;
  char *local_5b0 [4];
  ostringstream cmCTestLog_msg;
  char covLogFilename [1024];
  
  snprintf(covLogFilename,0x400,"CoverageLog-%d.xml",logFileCount);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  poVar1 = std::operator<<((ostream *)&cmCTestLog_msg,"Close file: ");
  poVar1 = std::operator<<(poVar1,covLogFilename);
  std::endl<char,std::char_traits<char>>(poVar1);
  this_00 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(this_00,5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
               ,0xac,local_5b0[0],(this->super_cmCTestGenericHandler).Quiet);
  std::__cxx11::string::~string((string *)local_5b0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  cmGeneratedFileStream::Close(ostr);
  return;
}

Assistant:

void cmCTestCoverageHandler::EndCoverageLogFile(cmGeneratedFileStream& ostr,
                                                int logFileCount)
{
  char covLogFilename[1024];
  snprintf(covLogFilename, sizeof(covLogFilename), "CoverageLog-%d.xml",
           logFileCount);
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     "Close file: " << covLogFilename << std::endl,
                     this->Quiet);
  ostr.Close();
}